

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFileSystem.cpp
# Opt level: O0

path * __thiscall irr::io::CFileSystem::getFileDir(CFileSystem *this,path *filename)

{
  uint uVar1;
  uint uVar2;
  u32 uVar3;
  path *in_RDI;
  bool in_stack_0000000f;
  s32 in_stack_00000010;
  u32 in_stack_00000014;
  s32 lastBackSlash;
  s32 lastSlash;
  path *ppVar4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  ppVar4 = in_RDI;
  uVar1 = core::string<char>::findLast
                    ((string<char> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (char)((ulong)in_RDI >> 0x38),(s32)in_RDI);
  uVar2 = core::string<char>::findLast
                    ((string<char> *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                     (char)((ulong)ppVar4 >> 0x38),(s32)ppVar4);
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2;
  uVar3 = core::string<char>::size((string<char> *)0x381a85);
  if (uVar2 < uVar3) {
    core::string<char>::subString
              (_lastBackSlash,in_stack_00000014,in_stack_00000010,in_stack_0000000f);
  }
  else {
    core::string<char>::string<char>(in_RDI,(char *)CONCAT44(uVar1,uVar2));
  }
  return ppVar4;
}

Assistant:

io::path CFileSystem::getFileDir(const io::path &filename) const
{
	// find last forward or backslash
	s32 lastSlash = filename.findLast('/');
	const s32 lastBackSlash = filename.findLast('\\');
	lastSlash = lastSlash > lastBackSlash ? lastSlash : lastBackSlash;

	if ((u32)lastSlash < filename.size())
		return filename.subString(0, lastSlash);
	else
		return _IRR_TEXT(".");
}